

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_histogram_of_intervals_lengths.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  size_type sVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  string local_460 [32];
  size_type local_440;
  size_t i;
  ostream local_418 [8];
  ofstream out;
  stringstream local_218 [8];
  stringstream gnuplot_script;
  ostream local_208 [376];
  undefined1 local_90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  undefined1 local_68 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> dominant_intervals;
  Persistence_intervals p;
  int persistence_dimension;
  int nbr;
  uint dominant_interval_number;
  char **argv_local;
  int argc_local;
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program computes a histogram of barcode\'s length. A number of bins in the histogram is a "
                          );
  std::operator<<(poVar3,"parameter of this program. \n");
  if ((argc == 3) || (argc == 4)) {
    persistence_dimension = std::numeric_limits<unsigned_int>::max();
    iVar2 = atoi(argv[2]);
    if (-1 < iVar2) {
      persistence_dimension = iVar2;
    }
    p.number_of_functions_for_projections_to_reals._4_4_ = -1;
    if (argc == 4) {
      p.number_of_functions_for_projections_to_reals._4_4_ = atoi(argv[3]);
    }
    this = &dominant_intervals.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Gudhi::Persistence_representations::Persistence_intervals::Persistence_intervals
              ((Persistence_intervals *)this,argv[1],persistence_dimension);
    Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_68,(Persistence_intervals *)this,
               (long)p.number_of_functions_for_projections_to_reals._4_4_);
    Gudhi::Persistence_representations::Persistence_intervals::histogram_of_lengths
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
               (Persistence_intervals *)
               &dominant_intervals.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
    std::__cxx11::stringstream::stringstream(local_218);
    poVar3 = std::operator<<(local_208,argv[1]);
    std::operator<<(poVar3,"_GnuplotScript");
    std::ofstream::ofstream(local_418);
    std::__cxx11::stringstream::str();
    uVar4 = std::__cxx11::string::c_str();
    std::ofstream::open(local_418,uVar4,0x10);
    std::__cxx11::string::~string((string *)&i);
    poVar3 = std::operator<<(local_418,"set style data histogram");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_418,"set style histogram cluster gap 1");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_418,"set style fill solid border -1");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_418,"plot \'-\' notitle");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_440 = 0;
    while( true ) {
      sVar1 = local_440;
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
      if (sVar1 == sVar5) break;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          local_440);
      poVar3 = (ostream *)std::ostream::operator<<(local_418,*pvVar6);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_440 = local_440 + 1;
    }
    std::ostream::operator<<(local_418,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    poVar3 = std::operator<<((ostream *)&std::clog,
                             "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                            );
    std::__cxx11::stringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar7);
    poVar3 = std::operator<<(poVar3,"\'\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_460);
    argv_local._4_4_ = 0;
    std::ofstream::~ofstream(local_418);
    std::__cxx11::stringstream::~stringstream(local_218);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_68);
    Gudhi::Persistence_representations::Persistence_intervals::~Persistence_intervals
              ((Persistence_intervals *)
               &dominant_intervals.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::clog,
                             "To run this program, please provide the name of a file with persistence diagram and number of "
                            );
    poVar3 = std::operator<<(poVar3,
                             "dominant intervals you would like to get. Set a negative number dominant intervals value "
                            );
    poVar3 = std::operator<<(poVar3,"If your file contains only birth-death pairs.\n");
    poVar3 = std::operator<<(poVar3,
                             "The third parameter is the dimension of the persistence that is to be used. If your "
                            );
    std::operator<<(poVar3,"file contains only birth-death pairs, you can skip this parameter\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes a histogram of barcode's length. A number of bins in the histogram is a "
            << "parameter of this program. \n";
  if ((argc != 3) && (argc != 4)) {
    std::clog << "To run this program, please provide the name of a file with persistence diagram and number of "
              << "dominant intervals you would like to get. Set a negative number dominant intervals value "
              << "If your file contains only birth-death pairs.\n"
              << "The third parameter is the dimension of the persistence that is to be used. If your "
              << "file contains only birth-death pairs, you can skip this parameter\n";
    return 1;
  }

  unsigned dominant_interval_number = std::numeric_limits<unsigned>::max();
  int nbr = atoi(argv[2]);
  if (nbr >= 0) {
    dominant_interval_number = static_cast<unsigned>(nbr);
  }

  int persistence_dimension = -1;
  if (argc == 4) {
    persistence_dimension = atoi(argv[3]);
  }

  Persistence_intervals p(argv[1], dominant_interval_number);
  std::vector<std::pair<double, double> > dominant_intervals = p.dominant_intervals(persistence_dimension);
  std::vector<size_t> histogram = p.histogram_of_lengths(10);

  std::stringstream gnuplot_script;
  gnuplot_script << argv[1] << "_GnuplotScript";
  std::ofstream out;
  out.open(gnuplot_script.str().c_str());

  out << "set style data histogram" << std::endl;
  out << "set style histogram cluster gap 1" << std::endl;
  out << "set style fill solid border -1" << std::endl;
  out << "plot '-' notitle" << std::endl;
  for (size_t i = 0; i != histogram.size(); ++i) {
    out << histogram[i] << std::endl;
  }
  out << std::endl;
  out.close();

  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
  return 0;
}